

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.h
# Opt level: O1

uint8_t * __thiscall
google::protobuf::io::EpsCopyOutputStream::WriteStringMaybeAliased
          (EpsCopyOutputStream *this,uint32_t num,string_view s,uint8_t *ptr)

{
  bool bVar1;
  uint uVar2;
  uint8_t *puVar3;
  uint uVar4;
  uint uVar5;
  size_t __n;
  long lVar6;
  
  __n = s._M_len;
  if ((long)__n < 0x80) {
    uVar2 = num * 8;
    lVar6 = 1;
    if (((0x7f < uVar2) && (lVar6 = 2, 0x3fff < uVar2)) && (lVar6 = 3, 0x1fffff < uVar2)) {
      lVar6 = 5 - (ulong)(uVar2 < 0x10000000);
    }
    if ((long)__n <= (long)(this->end_ + ~(ulong)(ptr + lVar6) + 0x10)) {
      uVar4 = uVar2 | 2;
      uVar5 = uVar4;
      if (0x7f < uVar2) {
        do {
          *ptr = (byte)uVar5 | 0x80;
          uVar4 = uVar5 >> 7;
          ptr = ptr + 1;
          bVar1 = 0x3fff < uVar5;
          uVar5 = uVar4;
        } while (bVar1);
      }
      *ptr = (byte)uVar4;
      ptr[1] = (byte)s._M_len;
      memcpy(ptr + 2,s._M_str,__n);
      return ptr + __n + 2;
    }
  }
  puVar3 = WriteStringMaybeAliasedOutline(this,num,s,ptr);
  return puVar3;
}

Assistant:

uint8_t* WriteStringMaybeAliased(uint32_t num, absl::string_view s,
                                   uint8_t* ptr) {
    std::ptrdiff_t size = s.size();
    if (ABSL_PREDICT_FALSE(size >= 128 ||
                           end_ - ptr + 16 - TagSize(num << 3) - 1 < size)) {
      return WriteStringMaybeAliasedOutline(num, s, ptr);
    }
    ptr = UnsafeVarint((num << 3) | 2, ptr);
    *ptr++ = static_cast<uint8_t>(size);
    std::memcpy(ptr, s.data(), size);
    return ptr + size;
  }